

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spec_parser.h
# Opt level: O0

string * __thiscall
sentencepiece::PrintProto_abi_cxx11_
          (string *__return_storage_ptr__,sentencepiece *this,NormalizerSpec *message,
          string_view name)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  bool bVar1;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  ostream *poVar3;
  string *psVar4;
  ostringstream local_1a0 [8];
  ostringstream os;
  NormalizerSpec *message_local;
  string_view name_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  __str._M_str = (char *)name._M_len;
  __str._M_len = (size_t)message;
  pbVar2 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)local_1a0,__str);
  std::operator<<(pbVar2," {\n");
  poVar3 = std::operator<<((ostream *)local_1a0,"  ");
  poVar3 = std::operator<<(poVar3,"name");
  poVar3 = std::operator<<(poVar3,": ");
  psVar4 = NormalizerSpec::name_abi_cxx11_((NormalizerSpec *)this);
  poVar3 = std::operator<<(poVar3,(string *)psVar4);
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<((ostream *)local_1a0,"  ");
  poVar3 = std::operator<<(poVar3,"add_dummy_prefix");
  poVar3 = std::operator<<(poVar3,": ");
  bVar1 = NormalizerSpec::add_dummy_prefix((NormalizerSpec *)this);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,bVar1);
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<((ostream *)local_1a0,"  ");
  poVar3 = std::operator<<(poVar3,"remove_extra_whitespaces");
  poVar3 = std::operator<<(poVar3,": ");
  bVar1 = NormalizerSpec::remove_extra_whitespaces((NormalizerSpec *)this);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,bVar1);
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<((ostream *)local_1a0,"  ");
  poVar3 = std::operator<<(poVar3,"escape_whitespaces");
  poVar3 = std::operator<<(poVar3,": ");
  bVar1 = NormalizerSpec::escape_whitespaces((NormalizerSpec *)this);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,bVar1);
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<((ostream *)local_1a0,"  ");
  poVar3 = std::operator<<(poVar3,"normalization_rule_tsv");
  poVar3 = std::operator<<(poVar3,": ");
  psVar4 = NormalizerSpec::normalization_rule_tsv_abi_cxx11_((NormalizerSpec *)this);
  poVar3 = std::operator<<(poVar3,(string *)psVar4);
  std::operator<<(poVar3,"\n");
  std::operator<<((ostream *)local_1a0,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

inline std::string PrintProto(const NormalizerSpec &message,
                              absl::string_view name) {
  std::ostringstream os;

  os << name << " {\n";

  PRINT_PARAM(name);
  PRINT_PARAM(add_dummy_prefix);
  PRINT_PARAM(remove_extra_whitespaces);
  PRINT_PARAM(escape_whitespaces);
  PRINT_PARAM(normalization_rule_tsv);

  os << "}\n";

  return os.str();
}